

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

char * nk_utf_at(char *buffer,int length,int index,nk_rune *unicode,int *len)

{
  int text_len;
  char *text;
  int local_38;
  int glyph_len;
  int src_len;
  int i;
  int *len_local;
  nk_rune *unicode_local;
  int index_local;
  int length_local;
  char *buffer_local;
  
  glyph_len = 0;
  local_38 = 0;
  if (buffer == (char *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x1ecb,"const char *nk_utf_at(const char *, int, int, nk_rune *, int *)");
  }
  if (unicode == (nk_rune *)0x0) {
    __assert_fail("unicode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x1ecc,"const char *nk_utf_at(const char *, int, int, nk_rune *, int *)");
  }
  if (len == (int *)0x0) {
    __assert_fail("len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x1ecd,"const char *nk_utf_at(const char *, int, int, nk_rune *, int *)");
  }
  if (((buffer == (char *)0x0) || (unicode == (nk_rune *)0x0)) || (len == (int *)0x0)) {
    buffer_local = (char *)0x0;
  }
  else if (index < 0) {
    *unicode = 0xfffd;
    *len = 0;
    buffer_local = (char *)0x0;
  }
  else {
    text._4_4_ = nk_utf_decode(buffer,unicode,length);
    while (text._4_4_ != 0) {
      if (glyph_len == index) {
        *len = text._4_4_;
        break;
      }
      glyph_len = glyph_len + 1;
      local_38 = local_38 + text._4_4_;
      text._4_4_ = nk_utf_decode(buffer + local_38,unicode,length - local_38);
    }
    if (glyph_len == index) {
      buffer_local = buffer + local_38;
    }
    else {
      buffer_local = (char *)0x0;
    }
  }
  return buffer_local;
}

Assistant:

NK_API const char*
nk_utf_at(const char *buffer, int length, int index,
    nk_rune *unicode, int *len)
{
    int i = 0;
    int src_len = 0;
    int glyph_len = 0;
    const char *text;
    int text_len;

    NK_ASSERT(buffer);
    NK_ASSERT(unicode);
    NK_ASSERT(len);

    if (!buffer || !unicode || !len) return 0;
    if (index < 0) {
        *unicode = NK_UTF_INVALID;
        *len = 0;
        return 0;
    }

    text = buffer;
    text_len = length;
    glyph_len = nk_utf_decode(text, unicode, text_len);
    while (glyph_len) {
        if (i == index) {
            *len = glyph_len;
            break;
        }

        i++;
        src_len = src_len + glyph_len;
        glyph_len = nk_utf_decode(text + src_len, unicode, text_len - src_len);
    }
    if (i != index) return 0;
    return buffer + src_len;
}